

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall XipFile::~XipFile(XipFile *this)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  void *pvVar2;
  char cVar3;
  uint32_t size;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  undefined8 *puVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  ReadWriter_ptr wrhdrptr;
  uint8_t v [4];
  ByteVector hdr;
  undefined1 local_58 [32];
  _Rb_tree_color local_38;
  undefined4 uStack_34;
  _Base_ptr local_30;
  
  (this->super_FileContainer)._vptr_FileContainer = (_func_int **)&PTR__XipFile_00146a88;
  if (this->_filelistmodified == true) {
    p_Var4 = (this->_files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->_files)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 == p_Var1) {
      uVar9 = 0;
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      uVar9 = 0;
      do {
        cVar3 = (**(code **)(**(long **)(p_Var4 + 2) + 0x40))();
        uVar9 = uVar9 + (cVar3 == 'F');
        uVar7 = uVar7 + (cVar3 != 'F');
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    }
    (this->_hdr).nummods = uVar7;
    (this->_hdr).numfiles = uVar9;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_58 + 0x18),
               (ulong)uVar7 * 0x20 + (ulong)uVar9 * 0x1c + 0x54,(allocator_type *)local_58);
    XipHeader::getdata(&this->_hdr,(uint8_t *)CONCAT44(local_58._28_4_,local_58._24_4_));
    lVar8 = CONCAT44(local_58._28_4_,local_58._24_4_) + 0x54;
    for (p_Var5 = (this->_files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != p_Var1;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      cVar3 = (**(code **)(**(long **)(p_Var5 + 2) + 0x40))();
      if (cVar3 == 'M') {
        (**(code **)(**(long **)(p_Var5 + 2) + 0x10))(*(long **)(p_Var5 + 2),lVar8);
        lVar8 = lVar8 + 0x20;
      }
    }
    for (p_Var5 = (this->_files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != p_Var1;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      cVar3 = (**(code **)(**(long **)(p_Var5 + 2) + 0x40))();
      if (cVar3 == 'F') {
        (**(code **)(**(long **)(p_Var5 + 2) + 0x10))(*(long **)(p_Var5 + 2),lVar8);
        lVar8 = lVar8 + 0x1c;
      }
    }
    size = allocmap::findfree(&this->_mm,local_38 - local_58._24_4_);
    (this->_hdr).hdrrva = size;
    if (size == 0) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = "xip: could not alloc space for romhdr";
      __cxa_throw(puVar6,&char_const*::typeinfo,0);
    }
    getrvareader((XipFile *)local_58,(uint32_t)this,size);
    (**(code **)(*(_func_int **)local_58._0_8_ + 0x18))
              (local_58._0_8_,CONCAT44(local_58._28_4_,local_58._24_4_),
               CONCAT44(uStack_34,local_38) - CONCAT44(local_58._28_4_,local_58._24_4_));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    getrvareader((XipFile *)local_58,(uint32_t)this,(this->_hdr).rvabase + 0x44);
    local_58._20_4_ = (this->_hdr).hdrrva;
    (**(code **)(*(_func_int **)local_58._0_8_ + 0x18))(local_58._0_8_,local_58 + 0x14,4);
    local_58._20_4_ = (this->_hdr).hdrrva - (this->_hdr).rvabase;
    (**(code **)(*(_func_int **)local_58._0_8_ + 0x18))(local_58._0_8_,local_58 + 0x14,4);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    pvVar2 = (void *)CONCAT44(local_58._28_4_,local_58._24_4_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)local_30 - (long)pvVar2);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
  ::~_Rb_tree(&(this->_files)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               *)&this->_mm);
  this_00 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

~XipFile()
    {
        if (!_filelistmodified)
            return;

        size_t numfiles= 0;
        size_t nummods= 0;
        for (auto i= _files.begin() ; i!=_files.end() ; ++i)
        {
            if (i->second->typechar()=='F')
                numfiles++;
            else
                nummods++;
        }
        _hdr.nummods= nummods;
        _hdr.numfiles= numfiles;

        ByteVector hdr(XipHeader::size()+_hdr.nummods*TocEntry::size()+_hdr.numfiles*FileEntry::size());

        _hdr.getdata(&hdr[0]);
        uint8_t *p= &hdr[XipHeader::size()];
        for (auto i= _files.begin() ; i!=_files.end() ; ++i)
            if (i->second->typechar()=='M') {
                i->second->getentry(p);
                p += TocEntry::size();
            }

        for (auto i= _files.begin() ; i!=_files.end() ; ++i)
            if (i->second->typechar()=='F') {
                i->second->getentry(p);
                p += FileEntry::size();
            }

        uint32_t oldhdrrva= _hdr.hdrrva;

        _hdr.hdrrva= _mm.findfree(hdr.size());
        if (_hdr.hdrrva==0)
            throw "xip: could not alloc space for romhdr";
        getrvareader(_hdr.hdrrva, hdr.size())->write(&hdr[0], hdr.size());

        ReadWriter_ptr wrhdrptr= getrvareader(_hdr.rvabase+0x44, 8);
        wrhdrptr->write32le(_hdr.hdrrva);
        wrhdrptr->write32le(_hdr.hdrrva-_hdr.rvabase);

        update_romhdrptr_in_nk(oldhdrrva, _hdr.hdrrva);
    }